

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O1

char * fy_token_format_text(fy_token *fyt,char *buf,size_t maxsz)

{
  char *pcVar1;
  size_t local_10;
  
  if (maxsz != 0) {
    if (fyt == (fy_token *)0x0) {
      *buf = '\0';
    }
    else {
      local_10 = maxsz;
      if (fyt->type == FYTT_TAG_DIRECTIVE) {
        fy_tag_directive_token_format_internal(fyt,buf,&local_10);
      }
      else {
        if (fyt->type != FYTT_TAG) {
          pcVar1 = fy_atom_format_text(&fyt->handle,buf,maxsz);
          return pcVar1;
        }
        fy_tag_token_format_internal(fyt,buf,&local_10);
      }
    }
  }
  return buf;
}

Assistant:

const char *fy_token_format_text(struct fy_token *fyt, char *buf, size_t maxsz) {
    const char *str;

    if (maxsz == 0)
        return buf;

    if (!fyt) {
        if (maxsz > 0)
            buf[0] = '\0';
        return buf;
    }

    switch (fyt->type) {

        case FYTT_TAG:
            return fy_tag_token_format_text(fyt, buf, maxsz);

        case FYTT_TAG_DIRECTIVE:
            return fy_tag_directive_token_format_text(fyt, buf, maxsz);

        default:
            break;
    }

    str = fy_atom_format_text(&fyt->handle, buf, maxsz);

    return str;
}